

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_RecordCallback_Test::TestBody
          (SSLVersionTest_RecordCallback_Test *this)

{
  tuple<ssl_ctx_st_*,_bssl::internal::Deleter> ctx;
  bool bVar1;
  ParamType *pPVar2;
  long lVar3;
  char *in_R9;
  ScopedTrace gtest_trace_4631;
  bool write_seen;
  bool read_seen;
  bool test_server;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  AssertionResult gtest_ar_;
  undefined2 local_aa;
  AssertHelper local_a8;
  CallbackType cb;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type sStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  
  pPVar2 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
  if (pPVar2->version != 0xfefc) {
    local_aa = 1;
    lVar3 = 0;
    do {
      if (lVar3 == 2) {
        return;
      }
      test_server = *(bool *)((long)&local_aa + lVar3);
      testing::ScopedTrace::ScopedTrace<bool>
                (&gtest_trace_4631,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1217,&test_server);
      bVar1 = testing::internal::AlwaysTrue();
      if (!bVar1) {
LAB_0017e3aa:
        testing::Message::Message((Message *)&gtest_fatal_failure_checker);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&cb,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1218,
                   "Expected: ResetContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&cb,(Message *)&gtest_fatal_failure_checker);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cb);
        if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
            _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
          (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                        _vptr_TestPartResultReporterInterface + 8))();
        }
        testing::ScopedTrace::~ScopedTrace(&gtest_trace_4631);
        return;
      }
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                (&gtest_fatal_failure_checker);
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        SSLVersionTest::ResetContexts(&this->super_SSLVersionTest);
      }
      bVar1 = gtest_fatal_failure_checker.has_new_fatal_failure_;
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                (&gtest_fatal_failure_checker);
      if (bVar1 != false) goto LAB_0017e3aa;
      read_seen = false;
      write_seen = false;
      cb.write_seen = &write_seen;
      cb.read_seen = &read_seen;
      ctx.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
           (&(this->super_SSLVersionTest).server_ctx_)[test_server ^ 1]._M_t.
           super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>;
      cb.this = this;
      SSL_CTX_set_msg_callback
                ((SSL_CTX *)
                 ctx.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                 TestBody::anon_class_1_0_00000001::__invoke);
      SSL_CTX_set_msg_callback_arg
                ((SSL_CTX *)
                 ctx.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&cb);
      local_68._8_8_ = 0;
      sStack_50 = 0;
      local_48._8_8_ = 0;
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface = (_func_int **)0x0;
      gtest_fatal_failure_checker.has_new_fatal_failure_ = false;
      gtest_fatal_failure_checker._9_7_ = 0;
      gtest_fatal_failure_checker.original_reporter_ = (TestPartResultReporterInterface *)&local_68;
      local_68._M_allocated_capacity = 0;
      local_58._M_p = (pointer)&local_48;
      local_48._M_allocated_capacity = 0;
      local_38._0_4_ = 0;
      local_38._4_1_ = false;
      local_38._5_3_ = 0;
      gtest_ar_.success_ =
           SSLVersionTest::Connect
                     (&this->super_SSLVersionTest,(ClientConfig *)&gtest_fatal_failure_checker);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      ClientConfig::~ClientConfig((ClientConfig *)&gtest_fatal_failure_checker);
      bVar1 = gtest_ar_.success_;
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_fatal_failure_checker,(internal *)&gtest_ar_,
                   (AssertionResult *)"Connect()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1247,(char *)gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c8);
LAB_0017e369:
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
        if (local_c8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_c8._M_head_impl + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        gtest_ar_.success_ = read_seen;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (read_seen == false) {
          testing::Message::Message((Message *)&local_c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_fatal_failure_checker,(internal *)&gtest_ar_,
                     (AssertionResult *)"read_seen","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1249,(char *)gtest_fatal_failure_checker.
                                     super_TestPartResultReporterInterface.
                                     _vptr_TestPartResultReporterInterface);
          testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_a8);
          std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        gtest_ar_.success_ = write_seen;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (write_seen == false) {
          testing::Message::Message((Message *)&local_c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_fatal_failure_checker,(internal *)&gtest_ar_,
                     (AssertionResult *)"write_seen","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x124a,(char *)gtest_fatal_failure_checker.
                                     super_TestPartResultReporterInterface.
                                     _vptr_TestPartResultReporterInterface);
          testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c8);
          goto LAB_0017e369;
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_4631);
      lVar3 = lVar3 + 1;
    } while (bVar1 != false);
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, RecordCallback) {
  if (version() == DTLS1_3_VERSION) {
    // The DTLS 1.3 record header is vastly different than the TLS or DTLS < 1.3
    // header format. Instead of checking that the record header is formatted as
    // expected here, the runner implementation in dtls.go is strict about what
    // it accepts.
    return;
  }
  for (bool test_server : {true, false}) {
    SCOPED_TRACE(test_server);
    ASSERT_NO_FATAL_FAILURE(ResetContexts());

    bool read_seen = false;
    bool write_seen = false;
    auto cb = [&](int is_write, int cb_version, int cb_type, const void *buf,
                  size_t len, SSL *ssl) {
      if (cb_type != SSL3_RT_HEADER) {
        return;
      }

      // The callback does not report a version for records.
      EXPECT_EQ(0, cb_version);

      if (is_write) {
        write_seen = true;
      } else {
        read_seen = true;
      }

      // Sanity-check that the record header is plausible.
      CBS cbs;
      CBS_init(&cbs, reinterpret_cast<const uint8_t *>(buf), len);
      uint8_t type;
      uint16_t record_version, length;
      ASSERT_TRUE(CBS_get_u8(&cbs, &type));
      ASSERT_TRUE(CBS_get_u16(&cbs, &record_version));
      EXPECT_EQ(record_version >> 8, is_dtls() ? 0xfe : 0x03);
      if (is_dtls()) {
        uint16_t epoch;
        ASSERT_TRUE(CBS_get_u16(&cbs, &epoch));
        uint16_t max_epoch = 1;
        EXPECT_LE(epoch, max_epoch) << "Invalid epoch: " << epoch;
        ASSERT_TRUE(CBS_skip(&cbs, 6));
      }
      ASSERT_TRUE(CBS_get_u16(&cbs, &length));
      EXPECT_EQ(0u, CBS_len(&cbs));
    };
    using CallbackType = decltype(cb);
    SSL_CTX *ctx = test_server ? server_ctx_.get() : client_ctx_.get();
    SSL_CTX_set_msg_callback(
        ctx, [](int is_write, int cb_version, int cb_type, const void *buf,
                size_t len, SSL *ssl, void *arg) {
          CallbackType *cb_ptr = reinterpret_cast<CallbackType *>(arg);
          (*cb_ptr)(is_write, cb_version, cb_type, buf, len, ssl);
        });
    SSL_CTX_set_msg_callback_arg(ctx, &cb);

    ASSERT_TRUE(Connect());

    EXPECT_TRUE(read_seen);
    EXPECT_TRUE(write_seen);
  }
}